

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::Option::remove_needs(Option *this,Option *opt)

{
  _Rb_tree_header *p_Var1;
  const_iterator __position;
  
  p_Var1 = &(this->needs_)._M_t._M_impl.super__Rb_tree_header;
  for (__position._M_node = (this->needs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)__position._M_node != p_Var1 &&
      (*(Option **)(__position._M_node + 1) != opt));
      __position._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node)) {
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::erase_abi_cxx11_((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                        *)&this->needs_,__position);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool remove_needs(Option *opt) {
        auto iterator = std::find(std::begin(needs_), std::end(needs_), opt);

        if(iterator != std::end(needs_)) {
            needs_.erase(iterator);
            return true;
        } else {
            return false;
        }
    }